

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFmap.c
# Opt level: O0

void map_segments(NF_link_map *l,void *addr,loadcmd *loadcmds,int nloadcmds,_Bool has_holes,int fd,
                 size_t maplength)

{
  char *pcVar1;
  int iVar2;
  uint *puVar3;
  ssize_t sVar4;
  void *__s;
  void *pvVar5;
  void *local_60;
  Elf64_Addr zeropage;
  Elf64_Addr zeroend;
  Elf64_Addr zero;
  int stat;
  void *tmp;
  loadcmd *c;
  int fd_local;
  _Bool has_holes_local;
  int nloadcmds_local;
  loadcmd *loadcmds_local;
  void *addr_local;
  NF_link_map *l_local;
  
  if (nloadcmds < 2) {
    printf("Wrong type of shared object or ELF: LOAD segment less than 2\n");
    exit(-1);
  }
  if (addr == (void *)0x0) {
    printf("please map the so in a malloc\'d region\n");
    exit(-1);
  }
  iVar2 = mprotect(addr,maplength,loadcmds->prot | 2);
  if (iVar2 != 0) {
    puVar3 = (uint *)__errno_location();
    printf("error when calling mprotect, and the error code is %d\n",(ulong)*puVar3);
    exit(-1);
  }
  l->l_map_start = (uint64_t)addr;
  l->l_map_end = l->l_map_start + maplength;
  l->l_addr = l->l_map_start - loadcmds->mapstart;
  tmp = loadcmds;
  if (has_holes) {
    mprotect((void *)(l->l_addr + loadcmds[nloadcmds + -2].mapend),
             loadcmds[nloadcmds + -1].mapstart - loadcmds[nloadcmds + -2].mapend,0);
  }
  while( true ) {
    if (loadcmds + nloadcmds <= tmp) {
      return;
    }
    sVar4 = pread(fd,(void *)(l->l_addr + *tmp),*(long *)((long)tmp + 8) - *tmp,
                  *(__off_t *)((long)tmp + 0x20));
    if (sVar4 < 0) break;
    mprotect((void *)(l->l_addr + *tmp),*(long *)((long)tmp + 8) - *tmp,
             *(uint *)((long)tmp + 0x28) | 2);
    if (((l->l_phdr == (Elf64_Phdr *)0x0) && (*(ulong *)((long)tmp + 0x20) <= l->l_phoff)) &&
       (l->l_phoff + (ulong)l->l_phnum * 0x38 <=
        (ulong)((*(long *)((long)tmp + 8) - *tmp) + *(long *)((long)tmp + 0x20)))) {
      l->l_phdr = (Elf64_Phdr *)((*tmp + l->l_phoff) - *(long *)((long)tmp + 0x20));
    }
    if (*(ulong *)((long)tmp + 0x10) < *(ulong *)((long)tmp + 0x18)) {
      __s = (void *)(l->l_addr + *(long *)((long)tmp + 0x10));
      pvVar5 = (void *)(l->l_addr + *(long *)((long)tmp + 0x18));
      local_60 = (void *)((long)__s + 0xfffU & 0xfffffffffffff000);
      if (pvVar5 < local_60) {
        local_60 = pvVar5;
      }
      if (__s < local_60) {
        memset(__s,0,(long)local_60 - (long)__s);
      }
      if (local_60 < pvVar5) {
        memset(local_60,0,((long)pvVar5 + 0xfffU & 0xfffffffffffff000) - (long)local_60);
      }
    }
    tmp = (void *)((long)tmp + 0x30);
  }
  pcVar1 = l->l_name;
  puVar3 = (uint *)__errno_location();
  printf("error when reading library %s, and the errno is %d",pcVar1,(ulong)*puVar3);
  exit(-1);
}

Assistant:

static void map_segments(struct NF_link_map *l, void *addr, struct loadcmd *loadcmds, int nloadcmds,
                         bool has_holes, int fd, size_t maplength)
//                    bool has_holes, int fd, size_t maplength, Elf64_Ehdr *e)
{
    /* here we mmap the segments into memory
     * The original implementation is like:
     *     First, do a mmap with length==maplength, assuring a piece of contiguious memory
     *     Then, each segment are mmap'd with MAP_FIXED on, right in the memory claimed before
     */
    /* At least now, I assume [addr, addr + maplength] is always clean */
    struct loadcmd *c = loadcmds;
    /* I'm not doing this because addr is specified */
    //l->l_map_start = (Elf64_Addr) mmap(addr, maplength, c->prot, MAP_COPY|MAP_FILE, fd, c->mapoff);
    if(nloadcmds < 2)
    {
        printf("Wrong type of shared object or ELF: LOAD segment less than 2\n");
        exit(-1);
    }

    void *tmp;
    if (addr)
    {
        //mmap(addr, maplength, c->prot, MAP_COPY|MAP_FILE|MAP_FIXED, fd, c->mapoff);
        //pread(fd, addr, maplength, c->mapoff);
        int stat = mprotect(addr, maplength, c->prot | PROT_WRITE);
        //this violate the original protection, which is bad...
        //but we are always legal to write on a heap
        if(stat)
        {
            printf("error when calling mprotect, and the error code is %d\n", errno);
            exit(-1);
        }
        l->l_map_start = (Elf64_Addr) addr;
    }    
    else
    {
        //tmp = mmap(addr, maplength, c->prot, MAP_COPY|MAP_FILE, fd, c->mapoff);
        //l->l_map_start = (Elf64_Addr)tmp; //deal with addr when it is 0
        printf("please map the so in a malloc'd region\n");
        exit(-1);
    }

    l->l_map_end = l->l_map_start + maplength;
    l->l_addr = l->l_map_start - c->mapstart;
    //mmap(addr, maplength, c->prot, MAP_COPY|MAP_FILE|MAP_FIXED, fd, c->mapoff);

    if (has_holes)
    {
        /* This is bad because it assume only the first LOAD contains executable pages
         * While in fact it is not
         */
        //mprotect((void *)(l->l_map_start + c->mapend - c->mapstart),
        //         loadcmds[nloadcmds - 1].mapstart - c->mapend,
        //         PROT_NONE);
        mprotect((void*) l->l_addr + loadcmds[nloadcmds - 2].mapend,
                    loadcmds[nloadcmds - 1].mapstart - loadcmds[nloadcmds - 2].mapend,
                    PROT_NONE);
    }

    while (c < &loadcmds[nloadcmds])
    {
        //mmap((void *) (l->l_addr + c->mapstart), c->mapend - c->mapstart, c->prot,
        //    MAP_FILE|MAP_COPY|MAP_FIXED,
        //    fd, c->mapoff);
        if(pread(fd, (void *) (l->l_addr + c->mapstart), c->mapend - c->mapstart, c->mapoff) < 0)
        {
            printf("error when reading library %s, and the errno is %d", l->l_name, errno);
            exit(-1);
        }
        mprotect((void *) (l->l_addr + c->mapstart), c->mapend - c->mapstart, c->prot | PROT_WRITE); //may have issues
        
        if(l->l_phdr == 0 &&
            l->l_phoff >= c->mapoff &&
            (size_t)(c->mapend - c->mapstart + c->mapoff) >= l->l_phoff + l->l_phnum * sizeof(Elf64_Phdr))
            /* find the segment that contains PHT */
            /* note that PHT may or may not be a seperate segment, and may or may not be included by a LOAD seg */
            l->l_phdr = (void *)(uintptr_t)(c->mapstart + l->l_phoff - c->mapoff);

        /* only .bss will cause this */
        if (c->allocend > c->dataend)
        {
            Elf64_Addr zero, zeroend, zeropage;
            zero = l->l_addr + c->dataend; //where zero should start
            zeroend = l->l_addr + c->allocend;
            zeropage = (zero + 4095) & (~4095);

            if (zeroend < zeropage)
                zeropage = zeroend;

            if (zeropage > zero)
            {
                /* In this case we have some .bss here */
                memset((void *)zero, '\0', zeropage - zero);
            }

            if (zeroend > zeropage)
            {
                /* need new page to store tons of bss variables here */
                //mmap((void *)zeropage, ALIGN_UP(zeroend, 4096) - zeropage,
                //    c->prot, MAP_ANON|MAP_PRIVATE|MAP_FIXED, -1, 0);
                memset((void *)zeropage, 0, ALIGN_UP(zeroend, 4096) - zeropage);
            }
        }
        ++c;
    }
}